

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

void __thiscall
capnp::anon_unknown_0::MembraneResponseHook::~MembraneResponseHook(MembraneResponseHook *this)

{
  kj::Own<capnp::MembranePolicy>::dispose(&this->policy);
  kj::Own<capnp::ResponseHook>::dispose(&this->inner);
  ResponseHook::~ResponseHook(&this->super_ResponseHook);
  return;
}

Assistant:

MembraneResponseHook(
      kj::Own<ResponseHook>&& inner, kj::Own<MembranePolicy>&& policy, bool reverse)
      : inner(kj::mv(inner)), policy(kj::mv(policy)), capTable(*this->policy, reverse) {}